

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  undefined8 *puVar1;
  undefined8 uVar2;
  code *pcVar3;
  uint uVar4;
  Type pHVar5;
  bool bVar6;
  BOOL BVar7;
  hash_t hVar8;
  undefined4 *puVar9;
  HashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> *dst;
  uint min;
  size_t requestedBytes;
  long lVar10;
  long lVar11;
  undefined8 local_68;
  undefined4 local_60;
  uint local_54;
  int *local_50;
  int *newBuckets;
  HashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> *pHStack_40;
  int modIndex;
  EntryType *newEntries;
  
  uVar4 = this->count * 2;
  newBuckets._4_4_ = 0x4b;
  min = 4;
  if (8 < uVar4) {
    min = this->count & 0x7fffffff;
  }
  newEntries._4_4_ = PrimePolicy::GetPrime(min,(int *)((long)&newBuckets + 4));
  local_50 = (Type)0x0;
  pHStack_40 = (Type)0x0;
  if (newEntries._4_4_ == this->bucketCount) {
    if (uVar4 == 0) {
      dst = (HashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> *)&DAT_00000008;
    }
    else {
      this_00 = &this->alloc->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      requestedBytes = 0xffffffffffffffff;
      if (-1 < (int)uVar4) {
        requestedBytes = (long)(int)uVar4 << 4;
      }
      BVar7 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar7 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar6) goto LAB_008b064e;
        *puVar9 = 0;
      }
      dst = (HashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            AllocInternal(this_00,requestedBytes);
      memset(dst,0,requestedBytes);
      memset(&(dst->
              super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              ).field_0x0 + requestedBytes,0,
             (requestedBytes + 0xf & 0xfffffffffffffff0) - requestedBytes);
      if (dst == (HashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar6) {
LAB_008b064e:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
      }
    }
    pHStack_40 = dst;
    Memory::
    CopyArray<JsUtil::HashedEntry<JsUtil::CharacterBuffer<char16_t>,Symbol*>,Symbol*,Memory::ArenaAllocator>
              (dst,(long)(int)uVar4,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = pHStack_40;
    this->size = uVar4;
    this->modFunctionIndex = newBuckets._4_4_;
  }
  else {
    Allocate(this,&local_50,&stack0xffffffffffffffc0,newEntries._4_4_,uVar4);
    local_54 = uVar4;
    Memory::
    CopyArray<JsUtil::HashedEntry<JsUtil::CharacterBuffer<char16_t>,Symbol*>,Symbol*,Memory::ArenaAllocator>
              (pHStack_40,(long)(int)uVar4,this->entries,(long)this->count);
    this->modFunctionIndex = newBuckets._4_4_;
    if (0 < this->count) {
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      lVar10 = 0;
      lVar11 = 0;
      do {
        pHVar5 = pHStack_40;
        if (-2 < *(int *)(&(pHStack_40->
                           super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                           ).field_0x8 + lVar10)) {
          puVar1 = *(undefined8 **)
                    (&(pHStack_40->
                      super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                      ).field_0x0 + lVar10);
          uVar2 = *puVar1;
          Memory::Recycler::WBSetBit((char *)&local_68);
          local_68 = uVar2;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
          local_60 = *(undefined4 *)(puVar1 + 1);
          hVar8 = CharacterBuffer::operator_cast_to_unsigned_int((CharacterBuffer *)&local_68);
          if (hVar8 * 2 + 1 !=
              *(int *)((long)&(pHVar5->
                              super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                              ).hashCode + lVar10)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                               ,0xce,
                               "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                               ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
            if (!bVar6) goto LAB_008b064e;
            *puVar9 = 0;
          }
          hVar8 = PrimePolicy::ModPrime
                            (*(uint *)((long)&(pHVar5->
                                              super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                                              ).hashCode + lVar10) >> 1,newEntries._4_4_,
                             this->modFunctionIndex);
          *(int *)(&(pHStack_40->
                    super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                    ).field_0x8 + lVar10) = local_50[(int)hVar8];
          local_50[(int)hVar8] = (int)lVar11;
        }
        lVar11 = lVar11 + 1;
        lVar10 = lVar10 + 0x10;
      } while (lVar11 < this->count);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    uVar4 = local_54;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,local_54,local_54 - this->size);
    }
    this->buckets = local_50;
    this->entries = pHStack_40;
    this->bucketCount = newEntries._4_4_;
    this->size = uVar4;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }